

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryReduceRight(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  RecyclableObject *pRVar3;
  bool bVar4;
  int n;
  CallFlags e;
  uint32 length_00;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var arg;
  uint64 length_01;
  RecyclableObject *local_d0;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  BigIndex length;
  undefined1 local_98 [8];
  AutoTagNativeLibraryEntry __tag;
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27e9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  JsReentLock::JsReentLock((JsReentLock *)&__tag.entry.next,pTVar6);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_98,function,(CallInfo)function_local,
             L"Array.prototype.reduceRight",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27f1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ec42,L"Array.prototype.reduceRight");
  }
  BigIndex::BigIndex((BigIndex *)&pArr,0);
  obj = (RecyclableObject *)0x0;
  local_d0 = (RecyclableObject *)0x0;
  JsReentLock::unlock((JsReentLock *)&__tag.entry.next);
  arg = Arguments::operator[]((Arguments *)&scriptContext,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (arg,pSVar5,L"Array.prototype.reduceRight",(JavascriptArray **)&obj,&local_d0,
             (BigIndex *)&pArr);
  JsReentLock::MutateArrayObject((JsReentLock *)&__tag.entry.next);
  JsReentLock::relock((JsReentLock *)&__tag.entry.next);
  bVar4 = BigIndex::IsSmallIndex((BigIndex *)&pArr);
  if (bVar4) {
    JsReentLock::unlock((JsReentLock *)&__tag.entry.next);
    pRVar3 = obj;
    pRVar2 = local_d0;
    length_00 = BigIndex::GetSmallIndex((BigIndex *)&pArr);
    callInfo_local =
         (CallInfo)
         ReduceRightHelper<unsigned_int>
                   ((JavascriptArray *)pRVar3,(TypedArrayBase *)0x0,pRVar2,length_00,
                    (Arguments *)&scriptContext,pSVar5);
  }
  else {
    JsReentLock::unlock((JsReentLock *)&__tag.entry.next);
    pRVar3 = obj;
    pRVar2 = local_d0;
    length_01 = BigIndex::GetBigIndex((BigIndex *)&pArr);
    callInfo_local =
         (CallInfo)
         ReduceRightHelper<unsigned_long>
                   ((JavascriptArray *)pRVar3,(TypedArrayBase *)0x0,pRVar2,length_01,
                    (Arguments *)&scriptContext,pSVar5);
  }
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_98);
  JsReentLock::~JsReentLock((JsReentLock *)&__tag.entry.next);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntryReduceRight(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.reduceRight"));

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_reduceRight);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reduceRight"));
        }

        BigIndex length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;
        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reduceRight"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
    }